

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O0

PropertyBase *
Protocol::MQTT::V5::
TypedProperty<(Protocol::MQTT::V5::PropertyType)18,_Protocol::MQTT::Common::DynamicString>::
allocateProp(void)

{
  PropertyBase *this;
  DynamicString local_1a;
  
  this = (PropertyBase *)operator_new(0x30);
  Common::DynamicString::DynamicString(&local_1a);
  Property<Protocol::MQTT::Common::DynamicString>::Property
            ((Property<Protocol::MQTT::Common::DynamicString> *)this,AssignedClientID,&local_1a,true
            );
  Common::DynamicString::~DynamicString(&local_1a);
  return this;
}

Assistant:

static PropertyBase * allocateProp() { return new Property<T>(type, T(), true) ; }